

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_api_wrapper.cpp
# Opt level: O3

int duckdb_shell_sqlite3_bind_blob
              (sqlite3_stmt *stmt,int idx,void *val,int length,_func_void_void_ptr *free_func)

{
  int iVar1;
  size_t sVar2;
  Value blob;
  string local_128;
  LogicalType local_108;
  Value local_f0;
  Value local_b0;
  Value local_70;
  
  if (val == (void *)0x0) {
    iVar1 = 0x15;
  }
  else {
    duckdb::LogicalType::LogicalType(&local_108,SQLNULL);
    duckdb::Value::Value(&local_f0,&local_108);
    duckdb::LogicalType::~LogicalType(&local_108);
    if (length < 0) {
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      sVar2 = strlen((char *)val);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,val,sVar2 + (long)val);
      duckdb::Value::BLOB(&local_70,&local_128);
      duckdb::Value::operator=(&local_f0,&local_70);
      duckdb::Value::~Value(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p);
      }
    }
    else {
      duckdb::Value::BLOB(&local_70,(const_data_ptr_t)val,(ulong)(uint)length);
      duckdb::Value::operator=(&local_f0,&local_70);
      duckdb::Value::~Value(&local_70);
    }
    if (&DAT_00000001 < free_func + 1) {
      (*free_func)(val);
    }
    duckdb::Value::Value(&local_b0,&local_f0);
    iVar1 = sqlite3_internal_bind_value(stmt,idx,&local_b0);
    duckdb::Value::~Value(&local_b0);
    duckdb::Value::~Value(&local_f0);
  }
  return iVar1;
}

Assistant:

int sqlite3_bind_blob(sqlite3_stmt *stmt, int idx, const void *val, int length, void (*free_func)(void *)) {
	if (!val) {
		return SQLITE_MISUSE;
	}
	Value blob;
	if (length < 0) {
		blob = Value::BLOB(string((const char *)val));
	} else {
		blob = Value::BLOB(const_data_ptr_cast(val), length);
	}
	if (free_func && ((ptrdiff_t)free_func) != -1) {
		free_func((void *)val);
		val = nullptr;
	}
	try {
		return sqlite3_internal_bind_value(stmt, idx, blob);
	} catch (std::exception &ex) {
		return SQLITE_ERROR;
	}
}